

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O0

void __thiscall
jbcoin::RPC::ErrorInfo::ErrorInfo
          (ErrorInfo *this,error_code_i code_,string *token_,string *message_)

{
  string *message__local;
  string *token__local;
  error_code_i code__local;
  ErrorInfo *this_local;
  
  this->code = code_;
  std::__cxx11::string::string((string *)&this->token,(string *)token_);
  std::__cxx11::string::string((string *)&this->message,(string *)message_);
  return;
}

Assistant:

ErrorInfo (error_code_i code_, std::string const& token_,
        std::string const& message_)
        : code (code_)
        , token (token_)
        , message (message_)
    { }